

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O0

void __thiscall
QGraphicsEllipseItem::paint
          (QGraphicsEllipseItem *this,QPainter *painter,QStyleOptionGraphicsItem *option,
          QWidget *widget)

{
  int iVar1;
  Int IVar2;
  QGraphicsEllipseItemPrivate *pQVar3;
  QPen *in_RSI;
  QFlags<QStyle::StateFlag> *in_RDI;
  long in_FS_OFFSET;
  QGraphicsEllipseItemPrivate *d;
  StateFlag in_stack_ffffffffffffffbc;
  QFlagsStorageHelper<QStyle::StateFlag,_4> local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = d_func((QGraphicsEllipseItem *)0x989789);
  QPainter::setPen(in_RSI);
  QPainter::setBrush((QBrush *)in_RSI);
  if (pQVar3->spanAngle != 0) {
    iVar1 = qAbs<int>(&pQVar3->spanAngle);
    if (iVar1 % 0x1680 == 0) {
      QPainter::drawEllipse((QRectF *)in_RSI);
      goto LAB_0098982a;
    }
  }
  QPainter::drawPie((QRectF *)in_RSI,(int)pQVar3 + 0x1a8,pQVar3->startAngle);
LAB_0098982a:
  local_c.super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorage<QStyle::StateFlag>)
       QFlags<QStyle::StateFlag>::operator&(in_RDI,in_stack_ffffffffffffffbc);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_c);
  if (IVar2 != 0) {
    qt_graphicsItem_highlightSelected
              ((QGraphicsItem *)option,(QPainter *)widget,(QStyleOptionGraphicsItem *)d);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsEllipseItem::paint(QPainter *painter, const QStyleOptionGraphicsItem *option,
                                 QWidget *widget)
{
    Q_D(QGraphicsEllipseItem);
    Q_UNUSED(widget);
    painter->setPen(d->pen);
    painter->setBrush(d->brush);
    if ((d->spanAngle != 0) && (qAbs(d->spanAngle) % (360 * 16) == 0))
        painter->drawEllipse(d->rect);
    else
        painter->drawPie(d->rect, d->startAngle, d->spanAngle);

    if (option->state & QStyle::State_Selected)
        qt_graphicsItem_highlightSelected(this, painter, option);
}